

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChParserOpenSim::initShapes
          (ChParserOpenSim *this,xml_node<char> *node,ChSystem *system)

{
  int iVar1;
  __shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  long lVar10;
  undefined8 uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  element_type *peVar14;
  element_type *this_00;
  bool bVar15;
  char cVar16;
  int iVar17;
  ostream *poVar18;
  ChBodyAuxRef *this_01;
  ChBodyAuxRef *this_02;
  iterator iVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var22;
  int iVar23;
  __shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2> *p_Var24;
  double *pdVar25;
  undefined8 *puVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  ChVector<double> v_2;
  undefined8 uStack_310;
  int local_308;
  int local_304;
  int local_300;
  undefined1 local_2f8 [48];
  shared_ptr<chrono::ChLink> link;
  double local_2b8;
  double dStack_2b0;
  ChVector<double> v;
  double local_290;
  ChQuaternion<double> local_280 [3];
  shared_ptr<chrono::ChCylinderShape> cylinder;
  ChVector<double> v_1;
  ChQuaternion<double> aCStack_1d0 [3];
  undefined1 local_168 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_158;
  shared_ptr<chrono::ChVisualMaterial> vis_mat;
  shared_ptr<chrono::ChVisualShape> local_108;
  undefined1 local_f8 [16];
  shared_ptr<chrono::ChVisualMaterial> local_e8;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> local_b8;
  undefined1 local_a8 [32];
  ChCoordsys<double> linkCoords;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  if (this->m_verbose == true) {
    poVar18 = std::operator<<((ostream *)&std::cout,"Creating collision and visualization shapes ");
    std::endl<char,std::char_traits<char>>(poVar18);
  }
  local_f8 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  p_Var2 = &((this->m_jointList).
             super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>;
  p_Var24 = &((this->m_jointList).
              super__Vector_base<std::shared_ptr<chrono::ChLink>,_std::allocator<std::shared_ptr<chrono::ChLink>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>;
  iVar23 = 0;
  while( true ) {
    if (p_Var24 == p_Var2) break;
    std::__shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>,p_Var24);
    (*((link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3f])(&linkCoords);
    peVar14 = link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->Body1 ==
        (ChBodyFrame *)0x0) {
      this_01 = (ChBodyAuxRef *)0x0;
    }
    else {
      this_01 = (ChBodyAuxRef *)
                __dynamic_cast((link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->Body1,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78);
    }
    if (peVar14->Body2 == (ChBodyFrame *)0x0) {
      this_02 = (ChBodyAuxRef *)0x0;
    }
    else {
      this_02 = (ChBodyAuxRef *)
                __dynamic_cast(peVar14->Body2,&ChBodyFrame::typeinfo,&ChBodyAuxRef::typeinfo,0x78);
    }
    std::__cxx11::string::string
              ((string *)&v,
               (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
               (allocator *)&v_1);
    iVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                     *)body_collision_info_abi_cxx11_,(key_type *)&v);
    std::__cxx11::string::~string((string *)&v);
    if (iVar19._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
      std::__cxx11::string::string
                ((string *)&v,
                 (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      pmVar20->body = this_01;
      std::__cxx11::string::~string((string *)&v);
    }
    std::__cxx11::string::string
              ((string *)&v,
               (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
               (allocator *)&v_1);
    iVar19 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                     *)body_collision_info_abi_cxx11_,(key_type *)&v);
    std::__cxx11::string::~string((string *)&v);
    if (iVar19._M_node == (_Base_ptr)(body_collision_info_abi_cxx11_ + 8)) {
      std::__cxx11::string::string
                ((string *)&v,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      pmVar20->body = this_02;
      std::__cxx11::string::~string((string *)&v);
    }
    std::__cxx11::string::string
              ((string *)&v,
               (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
               (allocator *)&v_1);
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                            *)body_collision_info_abi_cxx11_,(key_type *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::string
              ((string *)&v,
               (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
               (allocator *)&v_1);
    pmVar21 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                            *)body_collision_info_abi_cxx11_,(key_type *)&v);
    std::__cxx11::string::~string((string *)&v);
    bVar15 = ChBody::GetBodyFixed(&this_01->super_ChBody);
    if (bVar15) {
      pmVar20->level = 0;
      iVar17 = 0;
    }
    else {
      iVar17 = pmVar20->level;
    }
    pmVar21->level = iVar17 + 1;
    if (iVar23 <= iVar17) {
      iVar23 = iVar17 + 1;
    }
    ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)&v,this_01);
    local_2f8._4_4_ = v.m_data[1]._4_4_;
    local_2f8._0_4_ = v.m_data[1]._0_4_;
    local_2f8._8_8_ = v.m_data[2];
    iVar17 = (*(this_01->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(this_01);
    ChFrame<double>::TransformPointParentToLocal
              (&v,(ChFrame<double> *)CONCAT44(extraout_var,iVar17),&linkCoords.pos);
    dVar30 = v.m_data[2];
    local_168._4_4_ = v.m_data[0]._4_4_;
    local_168._0_4_ = v.m_data[0]._0_4_;
    local_168._8_4_ = v.m_data[1]._0_4_;
    local_168._12_4_ = v.m_data[1]._4_4_;
    auVar27 = vsubpd_avx(local_168,local_2f8._0_16_);
    local_a8 = ZEXT1632(auVar27);
    v.m_data[0]._0_4_ = auVar27._0_4_;
    v.m_data[0]._4_4_ = auVar27._4_4_;
    v.m_data[1]._0_4_ = auVar27._8_4_;
    v.m_data[1]._4_4_ = auVar27._12_4_;
    dVar3 = v.m_data[2] - local_290;
    v.m_data[2] = dVar3;
    dVar29 = ChVector<double>::Length(&v);
    if (1e-05 < dVar29) {
      auVar27 = vsubpd_avx(local_2f8._0_16_,local_168);
      v_2.m_data[0] = (double)local_f8._0_8_;
      v_2.m_data[1] = (double)local_f8._8_8_;
      v_2.m_data[2] = 0.0;
      v_1.m_data[0] = auVar27._0_8_;
      dVar29 = v_1.m_data[0];
      v_1.m_data[1] = auVar27._8_8_;
      dVar12 = v_1.m_data[1];
      v_1.m_data[2] = local_290 - dVar30;
      ChMatrix33<double>::Set_A_Xdir((ChMatrix33<double> *)&v,&v_1,&v_2);
      aCStack_1d0[0].m_data[1] = 0.0;
      aCStack_1d0[0].m_data[2] = 0.0;
      aCStack_1d0[0].m_data[3] = 0.0;
      v_1.m_data[2] = 0.0;
      aCStack_1d0[0].m_data[0] = 0.0;
      v_1.m_data[0] = 0.02;
      v_2.m_data[0] = dVar29;
      v_2.m_data[1] = dVar12;
      v_2.m_data[2] = local_290 - dVar30;
      auVar32._0_8_ = ChVector<double>::Length(&v_2);
      auVar32._8_56_ = extraout_var_01;
      auVar28 = vpermpd_avx2(local_a8,0xd0);
      auVar28 = vblendpd_avx(auVar28,auVar32._0_32_,1);
      auVar34._8_8_ = dVar3;
      auVar34._0_8_ = dVar3;
      auVar34._16_8_ = dVar3;
      auVar34._24_8_ = dVar3;
      auVar28 = vblendpd_avx(auVar28,auVar34,8);
      auVar5._8_8_ = 0x3fe0000000000000;
      auVar5._0_8_ = 0x3fe0000000000000;
      auVar5._16_8_ = 0x3fe0000000000000;
      auVar5._24_8_ = 0x3fe0000000000000;
      auVar28 = vmulpd_avx512vl(auVar28,auVar5);
      v_1.m_data[1] = auVar28._0_8_;
      v_1.m_data[2] = auVar28._8_8_;
      ChMatrix33<double>::Get_A_quaternion
                ((ChQuaternion<double> *)&cylinder,(ChMatrix33<double> *)&v);
      Q_from_AngZ((ChQuaternion<double> *)&vis_mat,-1.5707963267948966);
      ChQuaternion<double>::operator*
                ((ChQuaternion<double> *)&v_2,(ChQuaternion<double> *)&cylinder,
                 (ChQuaternion<double> *)&vis_mat);
      aCStack_1d0[0].m_data[0] = v_2.m_data[0];
      aCStack_1d0[0].m_data[1] = v_2.m_data[1];
      aCStack_1d0[0].m_data[2] = v_2.m_data[2];
      aCStack_1d0[0].m_data[3] = (double)uStack_310;
      std::__cxx11::string::string
                ((string *)&v_2,
                 (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&cylinder);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v_2);
      std::
      vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
      ::push_back(&pmVar20->cylinders,(value_type *)&v_1);
      std::__cxx11::string::~string((string *)&v_2);
    }
    iVar17 = (*(this_02->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3e])(this_02);
    ChFrame<double>::TransformPointParentToLocal
              (&v,(ChFrame<double> *)CONCAT44(extraout_var_00,iVar17),&linkCoords.pos);
    dVar3 = v.m_data[2];
    uVar9 = CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_);
    uVar11 = CONCAT44(v.m_data[1]._4_4_,v.m_data[1]._0_4_);
    ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)&v,this_02);
    auVar13._4_4_ = v.m_data[1]._4_4_;
    auVar13._0_4_ = v.m_data[1]._0_4_;
    auVar13._8_8_ = v.m_data[2];
    auVar7._8_8_ = uVar11;
    auVar7._0_8_ = uVar9;
    auVar27 = vsubpd_avx(auVar13,auVar7);
    local_a8._0_8_ = local_290;
    v.m_data[0]._0_4_ = auVar27._0_4_;
    v.m_data[0]._4_4_ = auVar27._4_4_;
    v.m_data[1]._0_4_ = auVar27._8_4_;
    v.m_data[1]._4_4_ = auVar27._12_4_;
    v.m_data[2] = local_290 - dVar3;
    local_168._0_8_ = v.m_data[2];
    dVar30 = ChVector<double>::Length(&v);
    if (1e-05 < dVar30) {
      local_2b8 = auVar27._0_8_;
      dStack_2b0 = auVar27._8_8_;
      v_2.m_data[0] = (double)local_f8._0_8_;
      v_2.m_data[1] = (double)local_f8._8_8_;
      v_2.m_data[2] = 0.0;
      v_1.m_data[0] = local_2b8;
      v_1.m_data[1] = dStack_2b0;
      v_1.m_data[2] = (double)local_168._0_8_;
      ChMatrix33<double>::Set_A_Xdir((ChMatrix33<double> *)&v,&v_1,&v_2);
      aCStack_1d0[0].m_data[1] = 0.0;
      aCStack_1d0[0].m_data[2] = 0.0;
      aCStack_1d0[0].m_data[3] = 0.0;
      v_1.m_data[2] = 0.0;
      aCStack_1d0[0].m_data[0] = 0.0;
      v_1.m_data[0] = 0.02;
      v_2.m_data[0] = local_2b8;
      v_2.m_data[1] = dStack_2b0;
      v_2.m_data[2] = (double)local_168._0_8_;
      auVar33._0_8_ = ChVector<double>::Length(&v_2);
      auVar33._8_56_ = extraout_var_02;
      auVar8._8_8_ = uVar11;
      auVar8._0_8_ = uVar9;
      auVar27 = vsubpd_avx(auVar8,auVar13);
      dVar3 = dVar3 - (double)local_a8._0_8_;
      auVar28 = vpermpd_avx2(ZEXT1632(auVar27),0xd0);
      auVar28 = vblendpd_avx(auVar28,auVar33._0_32_,1);
      auVar35._8_8_ = dVar3;
      auVar35._0_8_ = dVar3;
      auVar35._16_8_ = dVar3;
      auVar35._24_8_ = dVar3;
      auVar28 = vblendpd_avx(auVar28,auVar35,8);
      auVar6._8_8_ = 0x3fe0000000000000;
      auVar6._0_8_ = 0x3fe0000000000000;
      auVar6._16_8_ = 0x3fe0000000000000;
      auVar6._24_8_ = 0x3fe0000000000000;
      auVar28 = vmulpd_avx512vl(auVar28,auVar6);
      v_1.m_data[1] = auVar28._0_8_;
      v_1.m_data[2] = auVar28._8_8_;
      ChMatrix33<double>::Get_A_quaternion
                ((ChQuaternion<double> *)&cylinder,(ChMatrix33<double> *)&v);
      Q_from_AngZ((ChQuaternion<double> *)&vis_mat,-1.5707963267948966);
      ChQuaternion<double>::operator*
                ((ChQuaternion<double> *)&v_2,(ChQuaternion<double> *)&cylinder,
                 (ChQuaternion<double> *)&vis_mat);
      aCStack_1d0[0].m_data[0] = v_2.m_data[0];
      aCStack_1d0[0].m_data[1] = v_2.m_data[1];
      aCStack_1d0[0].m_data[2] = v_2.m_data[2];
      aCStack_1d0[0].m_data[3] = (double)uStack_310;
      std::__cxx11::string::string
                ((string *)&v_2,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&cylinder);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v_2);
      std::
      vector<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
      ::push_back(&pmVar20->cylinders,(value_type *)&v_1);
      std::__cxx11::string::~string((string *)&v_2);
    }
    if (this->m_verbose == true) {
      poVar18 = std::operator<<((ostream *)&std::cout,
                                (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name.
                                _M_dataplus._M_p);
      poVar18 = std::operator<<(poVar18," family is ");
      std::__cxx11::string::string
                ((string *)&v,
                 (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      poVar18 = (ostream *)std::ostream::operator<<(poVar18,pmVar20->family);
      std::endl<char,std::char_traits<char>>(poVar18);
      std::__cxx11::string::~string((string *)&v);
    }
    iVar17 = (*(this_01->super_ChBody).super_ChPhysicsItem.super_ChObj._vptr_ChObj[10])(this_01);
    if ((char)iVar17 == '\0') {
LAB_00e48cdd:
      if (this->m_verbose == true) {
        poVar18 = std::operator<<((ostream *)&std::cout,"Setting ");
        poVar18 = std::operator<<(poVar18,(this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.
                                          m_name._M_dataplus._M_p);
        poVar18 = std::operator<<(poVar18," to family ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->m_family_1);
        std::endl<char,std::char_traits<char>>(poVar18);
      }
      iVar17 = this->m_family_1;
      std::__cxx11::string::string
                ((string *)&v,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      pmVar20->family = iVar17;
      std::__cxx11::string::~string((string *)&v);
      iVar17 = this->m_family_2;
      std::__cxx11::string::string
                ((string *)&v,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
    }
    else {
      std::__cxx11::string::string
                ((string *)&v,
                 (this_01->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      iVar17 = pmVar20->family;
      iVar1 = this->m_family_2;
      std::__cxx11::string::~string((string *)&v);
      if (iVar17 == iVar1) goto LAB_00e48cdd;
      if (this->m_verbose == true) {
        poVar18 = std::operator<<((ostream *)&std::cout,"Setting ");
        poVar18 = std::operator<<(poVar18,(this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.
                                          m_name._M_dataplus._M_p);
        poVar18 = std::operator<<(poVar18," to family ");
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->m_family_2);
        std::endl<char,std::char_traits<char>>(poVar18);
      }
      iVar17 = this->m_family_2;
      std::__cxx11::string::string
                ((string *)&v,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
      pmVar20->family = iVar17;
      std::__cxx11::string::~string((string *)&v);
      iVar17 = this->m_family_1;
      std::__cxx11::string::string
                ((string *)&v,
                 (this_02->super_ChBody).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p,
                 (allocator *)&v_1);
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>_>_>
                              *)body_collision_info_abi_cxx11_,(key_type *)&v);
    }
    pmVar20->family_mask_nocollide = iVar17;
    std::__cxx11::string::~string((string *)&v);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var24 = p_Var24 + 1;
  }
  p_Var22 = (_Rb_tree_node_base *)body_collision_info_abi_cxx11_._24_8_;
  do {
    if (p_Var22 == (_Rb_tree_node_base *)(body_collision_info_abi_cxx11_ + 8)) {
      return;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
            *)&linkCoords,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
            *)(p_Var22 + 1));
    body_collision_struct::body_collision_struct
              ((body_collision_struct *)&v_2,(body_collision_struct *)(linkCoords.rot.m_data + 1));
    if (this->m_visType == PRIMITIVES) {
      std::make_shared<chrono::ChVisualMaterial>();
      v.m_data[0]._0_4_ = (float)local_300 / (float)iVar23;
      v.m_data[0]._4_4_ = 1.0 - v.m_data[0]._0_4_;
      v.m_data[1]._0_4_ = 0;
      ChVisualMaterial::SetDiffuseColor
                (vis_mat.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ChColor *)&v);
      chrono_types::make_shared<chrono::ChSphereShape,_0>();
      peVar14 = link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ((link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_ChLinkBase).super_ChPhysicsItem.super_ChObj.ChTime = 0.1;
      std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,
                 &vis_mat.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>);
      ChVisualShape::AddMaterial
                ((ChVisualShape *)peVar14,(shared_ptr<chrono::ChVisualMaterial> *)&local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      dVar3 = v_2.m_data[0];
      std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<chrono::ChSphereShape,void>
                ((__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> *)&local_108,
                 (__shared_ptr<chrono::ChSphereShape,_(__gnu_cxx::_Lock_policy)2> *)&link);
      ChBodyAuxRef::GetFrame_COG_to_REF((ChFrame<double> *)&v_1,(ChBodyAuxRef *)v_2.m_data[0]);
      cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&DAT_3ff0000000000000;
      cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ChFrame<double>::ChFrame
                ((ChFrame<double> *)&v,(ChVector<double> *)(v_1.m_data + 1),
                 (ChQuaternion<double> *)&cylinder);
      ChPhysicsItem::AddVisualShape((ChPhysicsItem *)dVar3,&local_108,(ChFrame<double> *)&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_108.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      dVar3 = v_2.m_data[2];
      for (pdVar25 = (double *)v_2.m_data[1]; pdVar25 != (double *)dVar3; pdVar25 = pdVar25 + 9) {
        v_1.m_data[0] = *pdVar25;
        v_1.m_data[1] = pdVar25[1];
        v_1.m_data[2] = pdVar25[2];
        aCStack_1d0[0].m_data[0] = pdVar25[5];
        aCStack_1d0[0].m_data[1] = pdVar25[6];
        aCStack_1d0[0].m_data[2] = pdVar25[7];
        aCStack_1d0[0].m_data[3] = pdVar25[8];
        chrono_types::make_shared<chrono::ChCylinderShape,_0>();
        this_00 = cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).rad = v_1.m_data[0];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = v_1.m_data[1];
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p1.m_data[0] = 0.0;
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p1.m_data[1] = v_1.m_data[1];
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar27 = vxorpd_avx512vl(auVar31,auVar4);
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p1.m_data[2] = 0.0;
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p2.m_data[0] = 0.0;
        dVar30 = (double)vmovlpd_avx(auVar27);
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p2.m_data[1] = dVar30;
        ((cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        gcylinder).p2.m_data[2] = 0.0;
        std::__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c8,
                   &vis_mat.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                  );
        ChVisualShape::AddMaterial
                  (&this_00->super_ChVisualShape,(shared_ptr<chrono::ChVisualMaterial> *)&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        dVar30 = v_2.m_data[0];
        std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::ChCylinderShape,void>
                  (local_d8,&cylinder.
                             super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                  );
        ChFrame<double>::ChFrame
                  ((ChFrame<double> *)&v,(ChVector<double> *)(v_1.m_data + 2),aCStack_1d0);
        ChPhysicsItem::AddVisualShape
                  ((ChPhysicsItem *)dVar30,(shared_ptr<chrono::ChVisualShape> *)local_d8,
                   (ChFrame<double> *)&v);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&cylinder.super___shared_ptr<chrono::ChCylinderShape,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&link.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&vis_mat.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    v_1.m_data[0] = 0.0;
    v_1.m_data[1] = 0.0;
    iVar17 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])();
    if (iVar17 == 0) {
      std::make_shared<chrono::ChMaterialSurfaceNSC>();
      ChMaterialSurface::SetFriction
                ((ChMaterialSurface *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_),this->m_friction
                );
      *(float *)(CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_) + 0x18) = this->m_restitution;
      std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&v_1,
                 (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&v);
LAB_00e4925b:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    }
    else if (iVar17 == 1) {
      std::make_shared<chrono::ChMaterialSurfaceSMC>();
      ChMaterialSurface::SetFriction
                ((ChMaterialSurface *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_),this->m_friction
                );
      lVar10 = CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_);
      *(undefined8 *)(lVar10 + 0x18) = *(undefined8 *)&this->m_restitution;
      *(float *)(lVar10 + 0x20) = this->m_poisson_ratio;
      auVar27._0_4_ = this->m_kn;
      auVar27._4_4_ = this->m_gn;
      auVar27._8_4_ = this->m_kt;
      auVar27._12_4_ = this->m_gt;
      auVar27 = vpermilps_avx(auVar27,0xd8);
      *(undefined1 (*) [16])(lVar10 + 0x30) = auVar27;
      std::__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChMaterialSurface,(__gnu_cxx::_Lock_policy)2> *)&v_1,
                 (__shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2> *)&v);
      goto LAB_00e4925b;
    }
    cVar16 = (**(code **)(*(long *)v_2.m_data[0] + 0x50))();
    if (cVar16 != '\0') {
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &v,(__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                       *)((long)v_2.m_data[0] + 0x198));
      (**(code **)(*(long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_) + 0x18))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      dVar3 = v_2.m_data[2];
      for (puVar26 = (undefined8 *)v_2.m_data[1]; dVar30 = v_2.m_data[0],
          puVar26 != (undefined8 *)dVar3; puVar26 = puVar26 + 9) {
        v.m_data[0]._0_4_ = (float)*puVar26;
        v.m_data[0]._4_4_ = (float)((ulong)*puVar26 >> 0x20);
        v.m_data[1]._0_4_ = (undefined4)puVar26[1];
        v.m_data[1]._4_4_ = (undefined4)((ulong)puVar26[1] >> 0x20);
        v.m_data[2] = (double)puVar26[2];
        local_280[0].m_data[0] = (double)puVar26[5];
        local_280[0].m_data[1] = (double)puVar26[6];
        local_280[0].m_data[2] = (double)puVar26[7];
        local_280[0].m_data[3] = (double)puVar26[8];
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_158,
                   (__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> *)&v_1);
        dVar29 = (double)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_);
        dVar12 = (double)CONCAT44(v.m_data[1]._4_4_,v.m_data[1]._0_4_);
        ChVisualMaterial::Default();
        AddCylinderGeometry((ChBody *)dVar30,(shared_ptr<chrono::ChMaterialSurface> *)&local_158,
                            dVar29,dVar12,(ChVector<double> *)(v.m_data + 2),local_280,false,
                            &local_e8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e8.
                    super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
      }
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &v,(__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                       *)((long)v_2.m_data[0] + 0x198));
      (**(code **)(*(long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_) + 200))
                ((long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_),local_308);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &v,(__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                       *)((long)v_2.m_data[0] + 0x198));
      (**(code **)(*(long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_) + 0xd8))
                ((long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_),local_304);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
      std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
                   &v,(__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                       *)((long)v_2.m_data[0] + 0x198));
      (**(code **)(*(long *)CONCAT44(v.m_data[0]._4_4_,v.m_data[0]._0_4_) + 0x20))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v_1.m_data + 1));
    std::
    _Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
    ::~_Vector_base((_Vector_base<chrono::utils::collision_cylinder_specs,_std::allocator<chrono::utils::collision_cylinder_specs>_>
                     *)(v_2.m_data + 1));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::body_collision_struct>
             *)&linkCoords);
    p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
  } while( true );
}

Assistant:

void ChParserOpenSim::initShapes(rapidxml::xml_node<>* node, ChSystem& system) {
    if (m_verbose)
        std::cout << "Creating collision and visualization shapes " << std::endl;

    // Keep the maximum depth so that we can color appropriately
    int max_depth_level = 0;

    // Go through the motions of constructing collision models, but don't do it until we have all of the necessary info
    for (auto link : m_jointList) {
        auto linkCoords = link->GetLinkAbsoluteCoords();
        // These need to be ChBodyAuxRef, but hopefully that's all that we'll have
        auto parent = dynamic_cast<ChBodyAuxRef*>(link->GetBody1());
        auto child = dynamic_cast<ChBodyAuxRef*>(link->GetBody2());

        // Add pointers to struct if they don't exist, struct entry should be default-constructed
        if (body_collision_info.find(parent->GetName()) == body_collision_info.end()) {
            body_collision_info[parent->GetName()].body = parent;
        }
        if (body_collision_info.find(child->GetName()) == body_collision_info.end()) {
            body_collision_info[child->GetName()].body = child;
        }
        body_collision_struct& parent_col_info = body_collision_info[parent->GetName()];
        body_collision_struct& child_col_info = body_collision_info[child->GetName()];

        // If a body is fixed, treat it as level 0
        if (parent->GetBodyFixed()) {
            parent_col_info.level = 0;
        }
        // Child is one more level than parent
        int child_level = parent_col_info.level + 1;
        // Keep a max depth so we know how to color it
        if (child_level > max_depth_level) {
            max_depth_level = child_level;
        }
        child_col_info.level = child_level;

        ChVector<> p1, p2;
        // Make cylinder from parent to outbound joint
        // First end is at parent COM
        p1 = parent->GetFrame_COG_to_REF().GetPos();
        // Second end is at joint location
        p2 = parent->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p1 - p2);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p1 - p2).Length() / 2;
            new_cyl.pos = (p2 - p1) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[parent->GetName()].cylinders.push_back(new_cyl);
        }

        // First end is at joint location
        p1 = child->GetFrame_REF_to_abs().TransformPointParentToLocal(linkCoords.pos);
        // Second end is at child COM
        p2 = child->GetFrame_COG_to_REF().GetPos();

        // Don't make a connection between overlapping bodies
        if ((p2 - p1).Length() > 1e-5) {
            ChMatrix33<> rot;
            rot.Set_A_Xdir(p2 - p1);
            // Center of cylinder is halfway between points
            collision_cylinder_specs new_cyl;
            new_cyl.rad = .02;
            new_cyl.hlen = (p2 - p1).Length() / 2;
            new_cyl.pos = (p1 - p2) / 2;
            new_cyl.rot = rot.Get_A_quaternion() * Q_from_AngZ(-CH_C_PI / 2);
            body_collision_info[child->GetName()].cylinders.push_back(new_cyl);
        }

        // Make cylinder from child to inbound joint
        if (m_verbose)
            std::cout << parent->GetName() << " family is " << body_collision_info[parent->GetName()].family
                      << std::endl;

        if ((parent->GetCollide() == false) || (body_collision_info[parent->GetName()].family == m_family_2)) {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_1 << std::endl;
            body_collision_info[child->GetName()].family = m_family_1;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_2;
        } else {
            if (m_verbose)
                std::cout << "Setting " << child->GetName() << " to family " << m_family_2 << std::endl;
            body_collision_info[child->GetName()].family = m_family_2;
            body_collision_info[child->GetName()].family_mask_nocollide = m_family_1;
        }
    }

    // Loop through the list of bodies in the model and create visualization and collision shapes
    for (auto body_info_pair : body_collision_info) {
        auto body_info = body_info_pair.second;

        // Create primitive visualization assets
        if (m_visType == VisType::PRIMITIVES) {
            // Assign a color based on the body's level in the tree hierarchy
            float colorVal = (1.0f * body_info.level) / max_depth_level;
            auto vis_mat = chrono_types::make_shared<ChVisualMaterial>();
            vis_mat->SetDiffuseColor(ChColor(colorVal, 1.0f - colorVal, 0.0f));

            // Create a sphere at the body COM
            auto sphere = chrono_types::make_shared<ChSphereShape>();
            sphere->GetSphereGeometry().rad = 0.1;
            sphere->AddMaterial(vis_mat);
            body_info.body->AddVisualShape(sphere, ChFrame<>(body_info.body->GetFrame_COG_to_REF().GetPos()));

            // Create visualization cylinders
            for (auto cyl_info : body_info.cylinders) {
                auto cylinder = chrono_types::make_shared<ChCylinderShape>();
                cylinder->GetCylinderGeometry().rad = cyl_info.rad;
                cylinder->GetCylinderGeometry().p1 = ChVector<>(0, cyl_info.hlen, 0);
                cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -cyl_info.hlen, 0);
                cylinder->AddMaterial(vis_mat);
                body_info.body->AddVisualShape(cylinder, ChFrame<>(cyl_info.pos, cyl_info.rot));
            }
        }

        // Create a contact material that will be shared by all shapes for this body
        std::shared_ptr<ChMaterialSurface> mat;
        switch (system.GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                matNSC->SetFriction(m_friction);
                matNSC->SetRestitution(m_restitution);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                matSMC->SetFriction(m_friction);
                matSMC->SetRestitution(m_restitution);
                matSMC->SetYoungModulus(m_young_modulus);
                matSMC->SetPoissonRatio(m_poisson_ratio);
                matSMC->SetKn(m_kn);
                matSMC->SetGn(m_gn);
                matSMC->SetKt(m_kt);
                matSMC->SetGt(m_gt);
                mat = matSMC;
                break;
            }
        }

        // Set collision shapes
        if (body_info.body->GetCollide()) {
            body_info.body->GetCollisionModel()->ClearModel();

            for (auto cyl_info : body_info.cylinders) {
                utils::AddCylinderGeometry(body_info.body, mat, cyl_info.rad, cyl_info.hlen, cyl_info.pos, cyl_info.rot,
                                           false);
            }

            body_info.body->GetCollisionModel()->SetFamily(body_info.family);
            body_info.body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(body_info.family_mask_nocollide);

            body_info.body->GetCollisionModel()->BuildModel();
        }
    }
}